

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_lcl.c
# Opt level: O0

err_t bignStart(void *state,bign_params *params)

{
  long lVar1;
  bool_t bVar2;
  void *stack_00;
  size_t sVar3;
  ec_o *ec_00;
  octet *xbase;
  octet *p;
  long *in_RSI;
  octet *in_RDI;
  void *stack;
  ec_o *ec;
  qr_o *f;
  size_t ec_keep;
  size_t f_keep;
  size_t n;
  size_t no;
  size_t in_stack_ffffffffffffffa8;
  qr_o *in_stack_ffffffffffffffb8;
  
  stack_00 = (void *)(*in_RSI * 2 + 7U >> 3);
  lVar1 = *in_RSI;
  sVar3 = gfpCreate_keep(0x15fe6c);
  ec_00 = (ec_o *)ecpCreateJ_keep(lVar1 * 2 + 0x3fU >> 6);
  xbase = in_RDI + (long)ec_00;
  p = xbase + sVar3;
  bVar2 = gfpCreate(in_stack_ffffffffffffffb8,p,in_stack_ffffffffffffffa8,(void *)0x15febb);
  if (((bVar2 != 0) &&
      (bVar2 = ecpCreateJ((ec_o *)no,(qr_o *)n,(octet *)f_keep,(octet *)ec_keep,f), bVar2 != 0)) &&
     (bVar2 = ecCreateGroup(ec_00,xbase,in_RDI,p,(size_t)p,0,stack_00), bVar2 != 0)) {
    objAppend(xbase,in_RDI,(size_t)p);
    return 0;
  }
  return 0x1f6;
}

Assistant:

err_t bignStart(void* state, const bign_params* params)
{
	// размерности
	size_t no, n;
	size_t f_keep;
	size_t ec_keep;
	// состояние
	qr_o* f;		/* поле */
	ec_o* ec;		/* кривая */
	void* stack;	/* вложенный стек */
	// pre
	ASSERT(memIsValid(params, sizeof(bign_params)));
	ASSERT(bignIsOperable(params));
	ASSERT(memIsValid(state, bignStart_keep(params->l, 0)));
	// определить размерности
	no = O_OF_B(2 * params->l);
	n = W_OF_B(2 * params->l);
	f_keep = gfpCreate_keep(no);
	ec_keep = ecpCreateJ_keep(n);
	// создать поле
	f = (qr_o*)((octet*)state + ec_keep);
	stack = (octet*)f + f_keep;
	if (!gfpCreate(f, params->p, no, stack))
		return ERR_BAD_PARAMS;
	ASSERT(wwBitSize(f->mod, n) == params->l * 2);
	ASSERT(wwGetBits(f->mod, 0, 2) == 3);
	// создать кривую и группу
	ec = (ec_o*)state;
	if (!ecpCreateJ(ec, f, params->a, params->b, stack) ||
		!ecCreateGroup(ec, 0, params->yG, params->q, no, 1, stack))
		return ERR_BAD_PARAMS;
	ASSERT(wwBitSize(ec->order, n) == params->l * 2);
	ASSERT(zzIsOdd(ec->order, n));
	// присоединить f к ec
	objAppend(ec, f, 0);
	// все нормально
	return ERR_OK;
}